

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O3

int sys_argparse(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  t_namelist *ptVar3;
  int *piVar4;
  uint i;
  char *pcVar5;
  long lVar6;
  char **ppcVar7;
  t_fontinfo *ptVar8;
  uint uVar9;
  char *pcVar10;
  int *piVar11;
  int *piVar12;
  bool bVar13;
  double dVar14;
  t_audiosettings as;
  float f;
  t_audiosettings local_98;
  float local_34;
  
  sys_get_audio_settings(&local_98);
  if (0 < argc) {
    do {
      pcVar5 = *argv;
      if (*pcVar5 != '-') break;
      if (pcVar5[1] == 'r') {
        bVar13 = argc != 1;
        if ((argc == 1) || (pcVar5[2] != '\0')) goto LAB_00174ce2;
        iVar2 = __isoc99_sscanf(argv[1],"%d",&local_98.a_srate);
        if (iVar2 < 1) {
          pcVar5 = *argv;
          goto LAB_00174ce2;
        }
        goto LAB_00175593;
      }
      bVar13 = argc != 1;
LAB_00174ce2:
      iVar2 = strcmp(pcVar5,"-inchannels");
      if (iVar2 == 0) {
        if (argc == 1) goto LAB_00175f14;
        pcVar5 = argv[1];
        piVar4 = &local_98.a_nchindev;
        piVar11 = local_98.a_chindevvec;
LAB_00175581:
        iVar2 = sys_parsedevlist(piVar4,piVar11,4,pcVar5);
joined_r0x00175987:
        if (iVar2 == 0) {
LAB_00175f14:
          sys_printusage();
          return 1;
        }
LAB_00175593:
        argc = argc + -2;
        argv = argv + 2;
      }
      else {
        iVar2 = strcmp(pcVar5,"-outchannels");
        if (iVar2 == 0) {
          if (argc == 1) goto LAB_00175f14;
LAB_00175573:
          pcVar5 = argv[1];
          piVar4 = &local_98.a_nchoutdev;
          piVar11 = local_98.a_choutdevvec;
          goto LAB_00175581;
        }
        iVar2 = strcmp(pcVar5,"-channels");
        if (iVar2 == 0) {
          if ((argc == 1) ||
             (iVar2 = sys_parsedevlist(&local_98.a_nchindev,local_98.a_chindevvec,4,argv[1]),
             iVar2 == 0)) goto LAB_00175f14;
          goto LAB_00175573;
        }
        iVar2 = strcmp(pcVar5,"-soundbuf");
        if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-audiobuf"), iVar2 == 0)) {
          if (argc == 1) goto LAB_00175f14;
          local_98.a_advance = atoi(argv[1]);
          goto LAB_00175593;
        }
        iVar2 = strcmp(pcVar5,"-callback");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar5,"-nocallback");
          if (iVar2 == 0) {
            local_98.a_callback = 0;
            goto LAB_0017574a;
          }
          iVar2 = strcmp(pcVar5,"-blocksize");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar5,"-sleepgrain");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_00175f14;
              dVar14 = atof(argv[1]);
              iVar2 = (int)(dVar14 * 1000.0);
              piVar4 = &sys_sleepgrain;
LAB_001755f5:
              *piVar4 = iVar2;
              goto LAB_00175593;
            }
            iVar2 = strcmp(pcVar5,"-nodac");
            if (iVar2 == 0) {
LAB_00175607:
              local_98.a_nchoutdev = 0;
              local_98.a_noutdev = 0;
              goto LAB_0017574a;
            }
            iVar2 = strcmp(pcVar5,"-noadc");
            if (iVar2 == 0) {
              local_98.a_nchindev = 0;
              local_98.a_nindev = 0;
              goto LAB_0017574a;
            }
            iVar2 = strcmp(pcVar5,"-nosound");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-noaudio"), iVar2 == 0)) {
              local_98.a_nchindev = 0;
              local_98.a_nindev = 0;
              goto LAB_00175607;
            }
            iVar2 = strcmp(pcVar5,"-oss");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-ossmidi"), iVar2 == 0)) {
              pcVar10 = "Pd compiled without OSS-support, ignoring \'%s\' flag\n";
LAB_00175740:
              fprintf(_stderr,pcVar10,pcVar5);
              goto LAB_0017574a;
            }
            iVar2 = strcmp(pcVar5,"-alsa");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-alsamidi"), iVar2 == 0)) {
              pcVar10 = "Pd compiled without ALSA-support, ignoring \'%s\' flag\n";
              goto LAB_00175740;
            }
            iVar2 = strcmp(pcVar5,"-alsaadd");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_00175f14;
              pcVar10 = "Pd compiled without ALSA-support, ignoring \'%s\' flag\n";
LAB_001756fa:
              fprintf(_stderr,pcVar10,pcVar5);
              goto LAB_00175593;
            }
            iVar2 = strcmp(pcVar5,"-jack");
            if (((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-jackconnect"), iVar2 == 0)) ||
               (iVar2 = strcmp(pcVar5,"-nojackconnect"), iVar2 == 0)) {
              pcVar10 = "Pd compiled without JACK-support, ignoring \'%s\' flag\n";
              goto LAB_00175740;
            }
            iVar2 = strcmp(pcVar5,"-jackname");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_00175f14;
              pcVar10 = "Pd compiled without JACK-support, ignoring \'%s\' flag\n";
              goto LAB_001756fa;
            }
            iVar2 = strcmp(pcVar5,"-pa");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-portaudio"), iVar2 == 0)) {
              pcVar10 = "Pd compiled without PortAudio-support, ignoring \'%s\' flag\n";
              goto LAB_00175740;
            }
            iVar2 = strcmp(pcVar5,"-asio");
            if (iVar2 == 0) {
              pcVar10 = "Pd compiled without ASIO-support, ignoring \'%s\' flag\n";
              goto LAB_001756fa;
            }
            iVar2 = strcmp(pcVar5,"-mmio");
            if (iVar2 == 0) {
              pcVar10 = "Pd compiled without MMIO-support, ignoring \'%s\' flag\n";
              goto LAB_00175740;
            }
            iVar2 = strcmp(pcVar5,"-audiounit");
            if (iVar2 == 0) {
              pcVar10 = "Pd compiled without AudioUnit-support, ignoring \'%s\' flag\n";
              goto LAB_00175740;
            }
            iVar2 = strcmp(pcVar5,"-esd");
            if (iVar2 == 0) {
              pcVar10 = "Pd compiled without ESD-support, ignoring \'%s\' flag\n";
              goto LAB_00175740;
            }
            iVar2 = strcmp(pcVar5,"-listdev");
            if (iVar2 == 0) {
              sys_listplease = 1;
              goto LAB_0017574a;
            }
            iVar2 = strcmp(pcVar5,"-soundindev");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-audioindev"), iVar2 == 0)) {
              if (argc == 1) goto LAB_00175f14;
              pcVar5 = argv[1];
              piVar4 = &local_98.a_nindev;
              piVar11 = local_98.a_indevvec;
              goto LAB_00175581;
            }
            iVar2 = strcmp(pcVar5,"-soundoutdev");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-audiooutdev"), iVar2 == 0)) {
              if (argc == 1) goto LAB_00175f14;
LAB_0017577e:
              pcVar5 = argv[1];
              piVar4 = &local_98.a_noutdev;
              piVar11 = local_98.a_outdevvec;
              goto LAB_00175581;
            }
            iVar2 = strcmp(pcVar5,"-sounddev");
            if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-audiodev"), iVar2 == 0)) {
              if ((argc == 1) ||
                 (iVar2 = sys_parsedevlist(&local_98.a_nindev,local_98.a_indevvec,4,argv[1]),
                 iVar2 == 0)) goto LAB_00175f14;
              goto LAB_0017577e;
            }
            iVar2 = strcmp(pcVar5,"-audioaddindev");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_00175f14;
              if (local_98.a_nindev < 0) {
                local_98.a_nindev = 0;
              }
              else if (3 < (uint)local_98.a_nindev) {
                sys_argparse_cold_13();
                goto LAB_00175593;
              }
              iVar2 = sys_audiodevnametonumber(0,argv[1]);
              if (iVar2 < 0) {
                sys_argparse_cold_14();
              }
              else {
                lVar6 = (long)local_98.a_nindev;
                local_98.a_nindev = local_98.a_nindev + 1;
                local_98.a_indevvec[lVar6] = iVar2 + 1;
              }
              goto LAB_00175593;
            }
            iVar2 = strcmp(pcVar5,"-audioaddoutdev");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_00175f14;
              if (local_98.a_noutdev < 0) {
                local_98.a_noutdev = 0;
              }
              else if (3 < (uint)local_98.a_noutdev) {
                sys_argparse_cold_11();
                goto LAB_00175593;
              }
              iVar2 = sys_audiodevnametonumber(1,argv[1]);
              if (iVar2 < 0) {
                sys_argparse_cold_12();
              }
              else {
LAB_001758b6:
                lVar6 = (long)local_98.a_noutdev;
                local_98.a_noutdev = local_98.a_noutdev + 1;
                local_98.a_outdevvec[lVar6] = iVar2 + 1;
              }
              goto LAB_00175593;
            }
            iVar2 = strcmp(pcVar5,"-audioadddev");
            if (iVar2 == 0) {
              if (argc == 1) goto LAB_00175f14;
              if (local_98.a_nindev < 0) {
                local_98.a_nindev = 0;
              }
              if (local_98.a_noutdev < 0) {
                local_98.a_noutdev = 0;
              }
              if ((uint)(local_98.a_nindev | local_98.a_noutdev) < 4) {
                iVar2 = sys_audiodevnametonumber(0,argv[1]);
                if (iVar2 < 0) {
                  sys_argparse_cold_9();
                }
                else {
                  lVar6 = (long)local_98.a_nindev;
                  local_98.a_nindev = local_98.a_nindev + 1;
                  local_98.a_indevvec[lVar6] = iVar2 + 1;
                }
                iVar2 = sys_audiodevnametonumber(1,argv[1]);
                if (-1 < iVar2) goto LAB_001758b6;
                sys_argparse_cold_10();
              }
              else {
                sys_argparse_cold_8();
              }
              goto LAB_00175593;
            }
            iVar2 = strcmp(pcVar5,"-nomidiin");
            if (iVar2 == 0) {
              piVar4 = &sys_nmidiin;
LAB_001758d4:
              *piVar4 = 0;
              goto LAB_0017574a;
            }
            iVar2 = strcmp(pcVar5,"-nomidiout");
            if (iVar2 == 0) {
              piVar4 = &sys_nmidiout;
              goto LAB_001758d4;
            }
            iVar2 = strcmp(pcVar5,"-nomidi");
            if (iVar2 == 0) {
              sys_nmidiout = 0;
              sys_nmidiin = 0;
              goto LAB_0017574a;
            }
            iVar2 = strcmp(pcVar5,"-midiindev");
            if (iVar2 != 0) {
              iVar2 = strcmp(pcVar5,"-midioutdev");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
LAB_00175963:
                pcVar5 = argv[1];
                piVar12 = &sys_nmidiout;
                piVar11 = &sys_nmidiout;
                piVar4 = sys_midioutdevlist;
                goto LAB_00175978;
              }
              iVar2 = strcmp(pcVar5,"-mididev");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                sys_parsedevlist(&sys_nmidiin,sys_midiindevlist,0x10,argv[1]);
                goto LAB_00175963;
              }
              iVar2 = strcmp(pcVar5,"-midiaddindev");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                if (sys_nmidiin < 0) {
                  sys_nmidiin = 0;
                }
                else if (0xf < (uint)sys_nmidiin) {
                  sys_argparse_cold_6();
                  goto LAB_00175593;
                }
                iVar2 = sys_mididevnametonumber(0,argv[1]);
                if (iVar2 < 0) {
                  sys_argparse_cold_7();
                }
                else {
                  piVar4 = sys_midiindevlist;
                  iVar1 = sys_nmidiin;
                  sys_nmidiin = sys_nmidiin + 1;
LAB_00175b4c:
                  piVar4[iVar1] = iVar2 + 1;
                }
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-midiaddoutdev");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                if (sys_nmidiout < 0) {
                  sys_nmidiout = 0;
                }
                else if (0xf < (uint)sys_nmidiout) {
                  sys_argparse_cold_4();
                  goto LAB_00175593;
                }
                iVar2 = sys_mididevnametonumber(1,argv[1]);
                if (-1 < iVar2) {
LAB_00175b34:
                  piVar4 = sys_midioutdevlist;
                  iVar1 = sys_nmidiout;
                  sys_nmidiout = sys_nmidiout + 1;
                  goto LAB_00175b4c;
                }
                sys_argparse_cold_5();
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-midiadddev");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                if (sys_nmidiin < 0) {
                  sys_nmidiin = 0;
                }
                if (sys_nmidiout < 0) {
                  sys_nmidiout = 0;
                }
                if ((uint)(sys_nmidiin | sys_nmidiout) < 0x10) {
                  iVar2 = sys_mididevnametonumber(1,argv[1]);
                  if (iVar2 < 0) {
                    sys_argparse_cold_2();
                  }
                  else {
                    lVar6 = (long)sys_nmidiin;
                    sys_nmidiin = sys_nmidiin + 1;
                    sys_midioutdevlist[lVar6] = iVar2 + 1;
                  }
                  iVar2 = sys_mididevnametonumber(1,argv[1]);
                  if (-1 < iVar2) goto LAB_00175b34;
                  sys_argparse_cold_3();
                }
                else {
                  sys_argparse_cold_1();
                }
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-path");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                ptVar3 = namelist_append_files((pd_maininstance.pd_stuff)->st_temppath,argv[1]);
                (pd_maininstance.pd_stuff)->st_temppath = ptVar3;
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-nostdpath");
              if (iVar2 == 0) {
                piVar4 = &sys_usestdpath;
                goto LAB_001758d4;
              }
              iVar2 = strcmp(pcVar5,"-stdpath");
              if (iVar2 == 0) {
                piVar4 = &sys_usestdpath;
                goto LAB_00175b67;
              }
              iVar2 = strcmp(pcVar5,"-helppath");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                ptVar3 = namelist_append_files((pd_maininstance.pd_stuff)->st_helppath,argv[1]);
                (pd_maininstance.pd_stuff)->st_helppath = ptVar3;
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-open");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                sys_openlist = namelist_append_files(sys_openlist,argv[1]);
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-lib");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                ptVar3 = namelist_append_files((pd_maininstance.pd_stuff)->st_externlist,argv[1]);
                ppcVar7 = (char **)pd_maininstance.pd_stuff;
LAB_00175c54:
                ((_instancestuff *)ppcVar7)->st_externlist = ptVar3;
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-font-size");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-font"), iVar2 == 0)) {
                if (argc == 1) goto LAB_00175f14;
                iVar2 = atoi(argv[1]);
                uVar9 = 0;
                ptVar8 = sys_fontspec;
                do {
                  ptVar8 = ptVar8 + 1;
                  if (iVar2 < ptVar8->fi_pointsize) goto LAB_00175c12;
                  uVar9 = uVar9 + 1;
                } while (uVar9 != 5);
                uVar9 = 5;
LAB_00175c12:
                iVar2 = sys_fontspec[uVar9].fi_pointsize;
                piVar4 = &sys_defaultfont;
                goto LAB_001755f5;
              }
              iVar2 = strcmp(pcVar5,"-font-face");
              if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"-typeface"), iVar2 == 0)) {
                if (argc == 1) goto LAB_00175f14;
                strncpy(sys_font,argv[1],99);
                sys_font[99] = '\0';
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-font-weight");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                strncpy(sys_fontweight,argv[1],9);
                sys_fontweight[9] = '\0';
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-verbose");
              if (iVar2 == 0) {
                sys_verbose = sys_verbose + 1;
                goto LAB_0017574a;
              }
              iVar2 = strcmp(pcVar5,"-noverbose");
              if (iVar2 == 0) {
                piVar4 = &sys_verbose;
                goto LAB_001758d4;
              }
              iVar2 = strcmp(pcVar5,"-version");
              if (iVar2 == 0) {
                sys_version = 1;
                goto LAB_0017574a;
              }
              if (((*pcVar5 == '-') && (pcVar5[1] == 'd')) &&
                 (!(bool)(bVar13 ^ 1) && pcVar5[2] == '\0')) {
                iVar2 = __isoc99_sscanf(argv[1],"%d",&sys_debuglevel);
                if (0 < iVar2) goto LAB_00175593;
                pcVar5 = *argv;
              }
              iVar2 = strcmp(pcVar5,"-loadbang");
              if (iVar2 == 0) {
                piVar4 = &sys_noloadbang;
                goto LAB_001758d4;
              }
              iVar2 = strcmp(pcVar5,"-noloadbang");
              if (iVar2 == 0) {
                piVar4 = &sys_noloadbang;
                goto LAB_00175b67;
              }
              iVar2 = strcmp(pcVar5,"-gui");
              if (iVar2 == 0) {
                sys_dontstartgui = '\0';
                goto LAB_0017574a;
              }
              iVar2 = strcmp(pcVar5,"-nogui");
              if (iVar2 == 0) {
                sys_dontstartgui = '\x01';
                goto LAB_0017574a;
              }
              iVar2 = strcmp(pcVar5,"-guiport");
              if (iVar2 == 0 && !(bool)(bVar13 ^ 1U)) {
                iVar2 = __isoc99_sscanf(argv[1],"%d",&sys_guisetportnumber);
                if (0 < iVar2) goto LAB_00175593;
                pcVar5 = *argv;
              }
              iVar2 = strcmp(pcVar5,"-nostderr");
              if (iVar2 == 0) {
                piVar4 = &sys_printtostderr;
                goto LAB_001758d4;
              }
              iVar2 = strcmp(pcVar5,"-stderr");
              if (iVar2 == 0) {
                piVar4 = &sys_printtostderr;
                goto LAB_00175b67;
              }
              iVar2 = strcmp(pcVar5,"-guicmd");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                ptVar3 = (t_namelist *)argv[1];
                ppcVar7 = &sys_guicmd;
                goto LAB_00175c54;
              }
              iVar2 = strcmp(pcVar5,"-send");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                sys_messagelist = namelist_append(sys_messagelist,argv[1],1);
                goto LAB_00175593;
              }
              iVar2 = strcmp(pcVar5,"-schedlib");
              if (iVar2 == 0) {
                if (argc == 1) goto LAB_00175f14;
                sys_externalschedlib = 1;
                strncpy(sys_externalschedlibname,argv[1],999);
                local_98.a_api = 0;
              }
              else {
                iVar2 = strcmp(pcVar5,"-extraflags");
                if (iVar2 != 0) {
                  iVar2 = strcmp(pcVar5,"-batch");
                  if (iVar2 == 0) {
                    sys_batch = '\x01';
                  }
                  else {
                    iVar2 = strcmp(pcVar5,"-nobatch");
                    if (iVar2 == 0) {
                      sys_batch = '\0';
                    }
                    else {
                      iVar2 = strcmp(pcVar5,"-autopatch");
                      if (iVar2 == 0) {
                        piVar4 = &sys_noautopatch;
                        goto LAB_001758d4;
                      }
                      iVar2 = strcmp(pcVar5,"-noautopatch");
                      if (iVar2 == 0) {
                        piVar4 = &sys_noautopatch;
                      }
                      else {
                        iVar2 = strcmp(pcVar5,"-compatibility");
                        if (iVar2 == 0) {
                          if ((argc == 1) ||
                             (iVar2 = __isoc99_sscanf(argv[1],"%f",&local_34), iVar2 < 1))
                          goto LAB_00175f14;
                          pd_compatibilitylevel = (int)(local_34 * 100.0 + 0.5);
                          goto LAB_00175ddb;
                        }
                        iVar2 = strcmp(pcVar5,"-rt");
                        if ((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"-realtime"), iVar2 != 0)) {
                          iVar2 = strcmp(pcVar5,"-nrt");
                          if ((iVar2 == 0) ||
                             ((iVar2 = strcmp(pcVar5,"-nort"), iVar2 == 0 ||
                              (iVar2 = strcmp(pcVar5,"-norealtime"), iVar2 == 0)))) {
                            piVar4 = &sys_hipriority;
                          }
                          else {
                            iVar2 = strcmp(pcVar5,"-sleep");
                            if (iVar2 != 0) {
                              iVar2 = strcmp(pcVar5,"-nosleep");
                              if (iVar2 != 0) {
                                iVar2 = strcmp(pcVar5,"-noprefs");
                                if (iVar2 != 0) {
                                  iVar2 = strcmp(pcVar5,"-prefsfile");
                                  if ((bool)(bVar13 ^ 1U | iVar2 != 0)) goto LAB_00175f14;
                                  goto LAB_00175593;
                                }
                                goto LAB_0017574a;
                              }
                              piVar4 = &sys_nosleep;
                              goto LAB_00175b67;
                            }
                            piVar4 = &sys_nosleep;
                          }
                          goto LAB_001758d4;
                        }
                        piVar4 = &sys_hipriority;
                      }
LAB_00175b67:
                      *piVar4 = 1;
                    }
                  }
                  goto LAB_0017574a;
                }
                if (argc == 1) goto LAB_00175f14;
                sys_extraflags = 1;
                strncpy(sys_extraflagsstring,argv[1],999);
              }
LAB_00175ddb:
              argv = argv + 2;
              argc = argc + -2;
              goto LAB_0017559a;
            }
            if (argc == 1) goto LAB_00175f14;
            pcVar5 = argv[1];
            piVar12 = &sys_nmidiin;
            piVar11 = &sys_nmidiin;
            piVar4 = sys_midiindevlist;
LAB_00175978:
            sys_parsedevlist(piVar11,piVar4,0x10,pcVar5);
            iVar2 = *piVar12;
            goto joined_r0x00175987;
          }
          local_98.a_blocksize = atoi(argv[1]);
          goto LAB_00175593;
        }
        local_98.a_callback = 1;
LAB_0017574a:
        argc = argc + -1;
        argv = argv + 1;
      }
LAB_0017559a:
    } while (0 < argc);
  }
  if (sys_batch == '\x01') {
    sys_dontstartgui = '\x01';
  }
  else if (sys_dontstartgui != '\x01') goto LAB_00175ebf;
  sys_printtostderr = 1;
LAB_00175ebf:
  if (sys_defaultfont == 0) {
    sys_defaultfont = 0xc;
  }
  if (0 < argc) {
    uVar9 = argc + 1;
    do {
      sys_openlist = namelist_append_files(sys_openlist,*argv);
      argv = argv + 1;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  sys_set_audio_settings(&local_98);
  return 0;
}

Assistant:

int sys_argparse(int argc, const char **argv)
{
    t_audiosettings as;
            /* get the current audio parameters.  These are set
            by the preferences mechanism (sys_loadpreferences()) or
            else are the default.  Overwrite them with any results
            of argument parsing, and store them again. */
    sys_get_audio_settings(&as);
    while ((argc > 0) && **argv == '-')
    {
                /* audio flags */
        if (!strcmp(*argv, "-r") && argc > 1 &&
            sscanf(argv[1], "%d", &as.a_srate) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-inchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-outchannels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-channels"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nchindev,
                    as.a_chindevvec, MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_nchoutdev,
                    as.a_choutdevvec, MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundbuf") || (!strcmp(*argv, "-audiobuf")))
        {
            if (argc < 2)
                goto usage;

            as.a_advance = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-callback"))
        {
            as.a_callback = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nocallback"))
        {
            as.a_callback = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-blocksize"))
        {
            as.a_blocksize = atoi(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-sleepgrain"))
        {
            if (argc < 2)
                goto usage;
            sys_sleepgrain = 1000 * atof(argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nodac"))
        {
            as.a_noutdev = as.a_nchoutdev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noadc"))
        {
            as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosound") || !strcmp(*argv, "-noaudio"))
        {
            as.a_noutdev = as.a_nchoutdev =  as.a_nindev = as.a_nchindev = 0;
            argc--; argv++;
        }
#ifdef USEAPI_OSS
        else if (!strcmp(*argv, "-oss"))
        {
            as.a_api = API_OSS;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-ossmidi"))
        {
            sys_set_midi_api(API_OSS);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-oss")) || (!strcmp(*argv, "-ossmidi")))
        {
            fprintf(stderr, "Pd compiled without OSS-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ALSA
        else if (!strcmp(*argv, "-alsa"))
        {
            as.a_api = API_ALSA;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_ALSA;
            alsa_adddev(argv[1]);
            argc -= 2; argv +=2;
        }
        else if (!strcmp(*argv, "-alsamidi"))
        {
            sys_set_midi_api(API_ALSA);
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-alsa")) || (!strcmp(*argv, "-alsamidi")))
        {
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-alsaadd"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without ALSA-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_JACK
        else if (!strcmp(*argv, "-jack"))
        {
            as.a_api = API_JACK;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nojackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(0);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackconnect"))
        {
            as.a_api = API_JACK;
            jack_autoconnect(1);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            as.a_api = API_JACK;
            jack_client_name(argv[1]);
            argc -= 2; argv +=2;
        }
#else
        else if ((!strcmp(*argv, "-jack"))
            || (!strcmp(*argv, "-jackconnect"))
            || (!strcmp(*argv, "-nojackconnect")))
        {
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-jackname"))
        {
            if (argc < 2)
                goto usage;
            fprintf(stderr, "Pd compiled without JACK-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_PORTAUDIO
        else if (!strcmp(*argv, "-pa") || !strcmp(*argv, "-portaudio")
            || !strcmp(*argv, "-asio"))
        {
            as.a_api = API_PORTAUDIO;
            sys_mmio = 0;
            argc--; argv++;
        }
#else
        else if ((!strcmp(*argv, "-pa")) || (!strcmp(*argv, "-portaudio")))
        {
            fprintf(stderr, "Pd compiled without PortAudio-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-asio"))
        {
            fprintf(stderr, "Pd compiled without ASIO-support, ignoring '%s' flag\n", *argv);
            argc -= 2; argv +=2;
        }
#endif
#ifdef USEAPI_MMIO
        else if (!strcmp(*argv, "-mmio"))
        {
            as.a_api = API_MMIO;
            sys_mmio = 1;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-mmio"))
        {
            fprintf(stderr, "Pd compiled without MMIO-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_AUDIOUNIT
        else if (!strcmp(*argv, "-audiounit"))
        {
            as.a_api = API_AUDIOUNIT;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-audiounit"))
        {
            fprintf(stderr, "Pd compiled without AudioUnit-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
#ifdef USEAPI_ESD
        else if (!strcmp(*argv, "-esd"))
        {
            as.a_api = API_ESD;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-esd"))
        {
            fprintf(stderr, "Pd compiled without ESD-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-listdev"))
        {
            sys_listplease = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-soundindev") ||
            !strcmp(*argv, "-audioindev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-soundoutdev") ||
            !strcmp(*argv, "-audiooutdev"))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-sounddev") || !strcmp(*argv, "-audiodev")))
        {
            if (argc < 2 ||
                !sys_parsedevlist(&as.a_nindev, as.a_indevvec,
                    MAXAUDIOINDEV, argv[1]) ||
                !sys_parsedevlist(&as.a_noutdev, as.a_outdevvec,
                    MAXAUDIOOUTDEV, argv[1]))
                        goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_nindev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d\n",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-audioadddev"))
        {
            if (argc < 2)
                goto usage;

            if (as.a_nindev < 0)
                as.a_nindev = 0;
            if (as.a_noutdev < 0)
                as.a_noutdev = 0;
            if (as.a_nindev < MAXAUDIOINDEV && as.a_noutdev < MAXAUDIOINDEV)
            {
                int devn = sys_audiodevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio input device: %s\n",
                        argv[1]);
                else as.a_indevvec[as.a_nindev++] = devn + 1;
                devn = sys_audiodevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find audio output device: %s\n",
                        argv[1]);
                else as.a_outdevvec[as.a_noutdev++] = devn + 1;
            }
            else fprintf(stderr, "number of audio devices limited to %d",
                MAXAUDIOINDEV);
            argc -= 2; argv += 2;
        }
                /* MIDI flags */
        else if (!strcmp(*argv, "-nomidiin"))
        {
            sys_nmidiin = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidiout"))
        {
            sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nomidi"))
        {
            sys_nmidiin = sys_nmidiout = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-midiindev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            if (!sys_nmidiin)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midioutdev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-mididev"))
        {
            if (argc < 2)
                goto usage;

            sys_parsedevlist(&sys_nmidiin, sys_midiindevlist, MAXMIDIINDEV,
                argv[1]);
            sys_parsedevlist(&sys_nmidiout, sys_midioutdevlist, MAXMIDIOUTDEV,
                argv[1]);
            if (!sys_nmidiout)
                goto usage;
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddindev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiin < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(0, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI input device: %s\n",
                        argv[1]);
                else sys_midiindevlist[sys_nmidiin++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiaddoutdev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d\n",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-midiadddev"))
        {
            if (argc < 2)
                goto usage;

            if (sys_nmidiin < 0)
                sys_nmidiin = 0;
            if (sys_nmidiout < 0)
                sys_nmidiout = 0;
            if (sys_nmidiin < MAXMIDIINDEV && sys_nmidiout < MAXMIDIINDEV)
            {
                int devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiin++] = devn + 1;
                devn = sys_mididevnametonumber(1, argv[1]);
                if (devn < 0)
                    fprintf(stderr, "Couldn't find MIDI output device: %s\n",
                        argv[1]);
                else sys_midioutdevlist[sys_nmidiout++] = devn + 1;
            }
            else fprintf(stderr, "number of MIDI devices limited to %d",
                MAXMIDIINDEV);
            argc -= 2; argv += 2;
        }
                /* other flags */
        else if (!strcmp(*argv, "-path"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_temppath =
                namelist_append_files(STUFF->st_temppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-nostdpath"))
        {
            sys_usestdpath = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stdpath"))
        {
            sys_usestdpath = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-helppath"))
        {
            if (argc < 2)
                goto usage;
            STUFF->st_helppath =
                namelist_append_files(STUFF->st_helppath, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-open"))
        {
            if (argc < 2)
                goto usage;

            sys_openlist = namelist_append_files(sys_openlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-lib"))
        {
            if (argc < 2)
                goto usage;

            STUFF->st_externlist =
                namelist_append_files(STUFF->st_externlist, argv[1]);
            argc -= 2; argv += 2;
        }
        else if ((!strcmp(*argv, "-font-size") || !strcmp(*argv, "-font")))
        {
            if (argc < 2)
                goto usage;

            sys_defaultfont = sys_nearestfontsize(atoi(argv[1]));
            argc -= 2;
            argv += 2;
        }
        else if ((!strcmp(*argv, "-font-face") || !strcmp(*argv, "-typeface")))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_font,*(argv+1),sizeof(sys_font)-1);
            sys_font[sizeof(sys_font)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-font-weight"))
        {
            if (argc < 2)
                goto usage;

            strncpy(sys_fontweight,*(argv+1),sizeof(sys_fontweight)-1);
            sys_fontweight[sizeof(sys_fontweight)-1] = 0;
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-verbose"))
        {
            sys_verbose++;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noverbose"))
        {
            sys_verbose=0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-version"))
        {
            sys_version = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-d") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_debuglevel) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-loadbang"))
        {
            sys_noloadbang = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noloadbang"))
        {
            sys_noloadbang = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-gui"))
        {
            sys_dontstartgui = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nogui"))
        {
            sys_dontstartgui = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guiport") && argc > 1 &&
            sscanf(argv[1], "%d", &sys_guisetportnumber) >= 1)
        {
            argc -= 2;
            argv += 2;
        }
        else if (!strcmp(*argv, "-nostderr"))
        {
            sys_printtostderr = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-stderr"))
        {
            sys_printtostderr = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-guicmd"))
        {
            if (argc < 2)
                goto usage;

            sys_guicmd = argv[1];
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-send"))
        {
            if (argc < 2)
                goto usage;

            sys_messagelist = namelist_append(sys_messagelist, argv[1], 1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(*argv, "-schedlib"))
        {
            if (argc < 2)
                goto usage;

            sys_externalschedlib = 1;
            strncpy(sys_externalschedlibname, argv[1],
                sizeof(sys_externalschedlibname) - 1);
#ifndef  __APPLE__
                /* no audio I/O please, unless overwritten by later args.
                This is to circumvent a problem running pd~ subprocesses
                with -nogui; they would open an audio device before pdsched.c
                could set the API to nothing.  For some reason though, on
                MACOSX this causes Pd to switch to JACK so we just give up
                and suppress the workaround there. */
            as.a_api = 0;
#endif
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-extraflags"))
        {
            if (argc < 2)
                goto usage;

            sys_extraflags = 1;
            strncpy(sys_extraflagsstring, argv[1],
                sizeof(sys_extraflagsstring) - 1);
            argv += 2;
            argc -= 2;
        }
        else if (!strcmp(*argv, "-batch"))
        {
            sys_batch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nobatch"))
        {
            sys_batch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-autopatch"))
        {
            sys_noautopatch = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noautopatch"))
        {
            sys_noautopatch = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-compatibility"))
        {
            float f;
            if (argc < 2)
                goto usage;

            if (sscanf(argv[1], "%f", &f) < 1)
                goto usage;
            pd_compatibilitylevel = 0.5 + 100. * f; /* e.g., 2.44 --> 244 */
            argv += 2;
            argc -= 2;
        }
#ifdef HAVE_UNISTD_H
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime"))
        {
            sys_hipriority = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort") || !strcmp(*argv, "-norealtime"))
        {
            sys_hipriority = 0;
            argc--; argv++;
        }
#else
        else if (!strcmp(*argv, "-rt") || !strcmp(*argv, "-realtime")
                 || !strcmp(*argv, "-nrt") || !strcmp(*argv, "-nort")
                 || !strcmp(*argv, "-norealtime"))
        {
            fprintf(stderr, "Pd compiled without realtime priority-support, ignoring '%s' flag\n", *argv);
            argc--; argv++;
        }
#endif
        else if (!strcmp(*argv, "-sleep"))
        {
            sys_nosleep = 0;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-nosleep"))
        {
            sys_nosleep = 1;
            argc--; argv++;
        }
        else if (!strcmp(*argv, "-noprefs")) /* did this earlier */
            argc--, argv++;
        else if (!strcmp(*argv, "-prefsfile") && argc > 1) /* this too */
            argc -= 2, argv +=2;
        else
        {
        usage:
            sys_printusage();
            return (1);
        }
    }
    if (sys_batch)
        sys_dontstartgui = 1;
    if (sys_dontstartgui)
        sys_printtostderr = 1;
#ifdef _WIN32
    if (sys_printtostderr)
        /* we need to tell Windows to output UTF-8 */
        SetConsoleOutputCP(CP_UTF8);
#endif
    if (!sys_defaultfont)
        sys_defaultfont = DEFAULTFONT;
    for (; argc > 0; argc--, argv++)
        sys_openlist = namelist_append_files(sys_openlist, *argv);

    sys_set_audio_settings(&as);
    return (0);
}